

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::SimpleTypeHandler<6UL>::GetSetter
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  ScriptContext *this_00;
  uint32 local_48;
  ushort local_42;
  uint32 indexVal;
  PropertyIndex index;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<6UL> *this_local;
  
  _indexVal = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
  BVar1 = GetDescriptor(this,setterValue_local._4_4_,&local_42);
  if (BVar1 == 0) {
    this_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
    BVar1 = ScriptContext::IsNumericPropertyId(this_00,setterValue_local._4_4_,&local_48);
    if (BVar1 == 0) {
      this_local._4_4_ = None;
    }
    else {
      this_local._4_4_ =
           DynamicTypeHandler::GetItemSetter
                     (&this->super_DynamicTypeHandler,pDStack_20,local_48,&info_local->m_instance,
                      _indexVal);
    }
  }
  else if ((this->descriptors[local_42].field_1.Attributes & 8) == 0) {
    this_local._4_4_ = Data;
    if ((this->descriptors[local_42].field_1.Attributes & 4) != 0) {
      this_local._4_4_ = WritableData;
    }
  }
  else {
    this_local._4_4_ = None;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index;
        PropertyValueInfo::SetNoCache(info, instance);
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                return None;
            }
            return (descriptors[index].Attributes & PropertyWritable) ? WritableData : Data;
        }

        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItemSetter(instance, indexVal, setterValue, requestContext);
        }

        return None;
    }